

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_frame.c
# Opt level: O1

int dwarf_get_fde_info_for_cfa_reg3_c
              (Dwarf_Fde_conflict fde,Dwarf_Addr pc_requested,Dwarf_Small *value_type,
              Dwarf_Unsigned *offset_relevant,Dwarf_Unsigned *register_num,Dwarf_Signed *offset,
              Dwarf_Block *block,Dwarf_Addr *row_pc_out,Dwarf_Bool *has_more_rows,
              Dwarf_Addr *subsequent_pc,Dwarf_Error *error)

{
  Dwarf_Debug dbg;
  int iVar1;
  Dwarf_Frame_s local_98;
  
  if (fde == (Dwarf_Fde_conflict)0x0) {
    _dwarf_error((Dwarf_Debug)0x0,error,0x5c);
  }
  else {
    dbg = fde->fd_dbg;
    if ((dbg != (Dwarf_Debug)0x0) && (dbg->de_magic == 0xebfdebfd)) {
      local_98.fr_reg = (Dwarf_Reg_Rule_s *)0x0;
      local_98.fr_next = (Dwarf_Frame)0x0;
      local_98.fr_cfa_rule.ru_block.bl_section_offset = 0;
      local_98.fr_reg_count = 0;
      local_98.fr_cfa_rule.ru_block.bl_data = (Dwarf_Ptr)0x0;
      local_98.fr_cfa_rule.ru_block.bl_from_loclist = '\0';
      local_98.fr_cfa_rule.ru_block._17_7_ = 0;
      local_98.fr_cfa_rule.ru_args_size = 0;
      local_98.fr_cfa_rule.ru_block.bl_len = 0;
      local_98.fr_cfa_rule.ru_register = 0;
      local_98.fr_cfa_rule.ru_offset = 0;
      local_98.fr_loc = 0;
      local_98.fr_cfa_rule.ru_is_offset = '\0';
      local_98.fr_cfa_rule.ru_value_type = '\0';
      local_98.fr_cfa_rule._2_6_ = 0;
      iVar1 = init_reg_rules_alloc(dbg,&local_98,dbg->de_frame_reg_rules_entry_count,error);
      if (iVar1 != 0) {
        return iVar1;
      }
      iVar1 = _dwarf_get_fde_info_for_a_pc_row
                        (fde,pc_requested,&local_98,dbg->de_frame_cfa_col_number,has_more_rows,
                         subsequent_pc,error);
      if (iVar1 != 0) {
        free(local_98.fr_reg);
        return iVar1;
      }
      if (register_num != (Dwarf_Unsigned *)0x0) {
        *register_num = local_98.fr_cfa_rule.ru_register;
      }
      if (offset != (Dwarf_Signed *)0x0) {
        *offset = local_98.fr_cfa_rule.ru_offset;
      }
      if (row_pc_out != (Dwarf_Addr *)0x0) {
        *row_pc_out = local_98.fr_loc;
      }
      if (block != (Dwarf_Block *)0x0) {
        block->bl_from_loclist = local_98.fr_cfa_rule.ru_block.bl_from_loclist;
        *(undefined7 *)&block->field_0x11 = local_98.fr_cfa_rule.ru_block._17_7_;
        block->bl_section_offset = local_98.fr_cfa_rule.ru_block.bl_section_offset;
        block->bl_len = local_98.fr_cfa_rule.ru_block.bl_len;
        block->bl_data = local_98.fr_cfa_rule.ru_block.bl_data;
      }
      *value_type = local_98.fr_cfa_rule.ru_value_type;
      *offset_relevant = (long)local_98.fr_cfa_rule.ru_is_offset;
      free(local_98.fr_reg);
      return 0;
    }
    _dwarf_error_string((Dwarf_Debug)0x0,error,0x5d,
                        "DW_DLE_FDE_DBG_NULL: An fde contains a stale Dwarf_Debug ");
  }
  return 1;
}

Assistant:

int
dwarf_get_fde_info_for_cfa_reg3_c(Dwarf_Fde fde,
    Dwarf_Addr      pc_requested,
    Dwarf_Small    *value_type,
    Dwarf_Unsigned *offset_relevant,
    Dwarf_Unsigned *register_num,
    Dwarf_Signed   *offset,
    Dwarf_Block    *block,
    Dwarf_Addr     *row_pc_out,
    Dwarf_Bool     *has_more_rows,
    Dwarf_Addr     *subsequent_pc,
    Dwarf_Error    *error)
{
    struct Dwarf_Frame_s fde_table;
    int res = DW_DLV_ERROR;
    Dwarf_Debug dbg = 0;

    Dwarf_Unsigned table_real_data_size = 0;

    FDE_NULL_CHECKS_AND_SET_DBG(fde, dbg);

    table_real_data_size = dbg->de_frame_reg_rules_entry_count;
    res = _dwarf_initialize_fde_table(dbg, &fde_table,
        table_real_data_size, error);
    if (res != DW_DLV_OK)
        return res;
    res = _dwarf_get_fde_info_for_a_pc_row(fde, pc_requested,
        &fde_table,
        dbg->de_frame_cfa_col_number,has_more_rows,
        subsequent_pc,error);
    if (res != DW_DLV_OK) {
        _dwarf_free_fde_table(&fde_table);
        return res;
    }
    if (register_num) {
        *register_num = fde_table.fr_cfa_rule.ru_register;
    }
    if (offset) {
        *offset = fde_table.fr_cfa_rule.ru_offset;
    }
    if (row_pc_out != NULL) {
        *row_pc_out = fde_table.fr_loc;
    }
    if (block) {
        *block = fde_table.fr_cfa_rule.ru_block;
    }
    /*  Without value_type the data cannot be
        understood, so we insist
        on it being present, we don't test it. */
    *value_type = fde_table.fr_cfa_rule.ru_value_type;
    *offset_relevant = fde_table.fr_cfa_rule.ru_is_offset;
    _dwarf_free_fde_table(&fde_table);
    return DW_DLV_OK;
}